

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O0

void idct64_stage10_avx2(__m256i *u,__m256i *cospim32,__m256i *cospi32,__m256i *clamp_lo,
                        __m256i *clamp_hi,__m256i *rnding,int bit)

{
  __m256i in1;
  __m256i in0;
  undefined8 *puVar1;
  long in_RDI;
  __m256i *in_XMM0_Qa;
  __m256i *palVar2;
  __m256i *in_XMM0_Qb;
  __m256i *palVar3;
  __m256i *in_YMM0_H;
  __m256i *palVar4;
  __m256i *in_register_00001218;
  __m256i *palVar5;
  __m256i *palVar6;
  int i;
  __m256i temp4;
  __m256i temp3;
  __m256i temp2;
  __m256i temp1;
  int local_e4;
  __m256i *in_stack_ffffffffffffff38;
  __m256i *palVar7;
  __m256i *in_stack_ffffffffffffff40;
  __m256i *palVar8;
  __m256i *in_stack_ffffffffffffff48;
  int iVar10;
  __m256i *palVar9;
  __m256i *in_stack_ffffffffffffff50;
  __m256i *palVar11;
  __m256i *in_stack_ffffffffffffff58;
  __m256i *palVar12;
  __m256i *in_stack_ffffffffffffff60;
  __m256i *palVar13;
  __m256i *in_stack_ffffffffffffff68;
  __m256i *palVar14;
  __m256i *in_stack_ffffffffffffff70;
  __m256i *palVar15;
  undefined8 in_stack_ffffffffffffff78;
  __m256i *palVar16;
  undefined8 in_stack_ffffffffffffff80;
  __m256i *palVar17;
  undefined8 in_stack_ffffffffffffff88;
  __m256i *palVar18;
  longlong in_stack_ffffffffffffff90;
  __m256i *palVar19;
  
  for (local_e4 = 0; local_e4 < 0x10; local_e4 = local_e4 + 1) {
    puVar1 = (undefined8 *)(in_RDI + (long)local_e4 * 0x20);
    in_XMM0_Qa = (__m256i *)*puVar1;
    in_XMM0_Qb = (__m256i *)puVar1[1];
    in_YMM0_H = (__m256i *)puVar1[2];
    in_register_00001218 = (__m256i *)puVar1[3];
    in0[1] = in_stack_ffffffffffffff80;
    in0[0] = in_stack_ffffffffffffff78;
    in0[2] = in_stack_ffffffffffffff88;
    in0[3] = in_stack_ffffffffffffff90;
    in1[1] = (longlong)in_stack_ffffffffffffff60;
    in1[0] = (longlong)in_stack_ffffffffffffff58;
    in1[2] = (longlong)in_stack_ffffffffffffff68;
    in1[3] = (longlong)in_stack_ffffffffffffff70;
    addsub_avx2(in0,in1,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  half_btf_avx2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                (int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  iVar10 = (int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  palVar6 = in_register_00001218;
  palVar16 = in_XMM0_Qa;
  palVar17 = in_XMM0_Qb;
  palVar18 = in_YMM0_H;
  half_btf_avx2(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,iVar10);
  palVar12 = in_XMM0_Qa;
  palVar13 = in_XMM0_Qb;
  palVar14 = in_YMM0_H;
  palVar15 = palVar6;
  half_btf_avx2(in_YMM0_H,in_XMM0_Qb,in_XMM0_Qa,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                iVar10);
  palVar7 = in_XMM0_Qa;
  palVar8 = in_XMM0_Qb;
  palVar9 = in_YMM0_H;
  palVar11 = palVar6;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar6,in_YMM0_H,(int)((ulong)in_XMM0_Qb >> 0x20));
  palVar2 = in_XMM0_Qa;
  palVar3 = in_XMM0_Qb;
  palVar4 = in_YMM0_H;
  palVar5 = palVar6;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,(int)((ulong)palVar8 >> 0x20));
  *(__m256i **)(in_RDI + 0x680) = palVar2;
  *(__m256i **)(in_RDI + 0x688) = palVar3;
  *(__m256i **)(in_RDI + 0x690) = palVar4;
  *(__m256i **)(in_RDI + 0x698) = palVar6;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,(int)((ulong)palVar8 >> 0x20));
  *(__m256i **)(in_RDI + 0x6a0) = palVar2;
  *(__m256i **)(in_RDI + 0x6a8) = palVar3;
  *(__m256i **)(in_RDI + 0x6b0) = palVar4;
  *(__m256i **)(in_RDI + 0x6b8) = palVar6;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,(int)((ulong)palVar8 >> 0x20));
  *(__m256i **)(in_RDI + 0x6c0) = palVar2;
  *(__m256i **)(in_RDI + 0x6c8) = palVar3;
  *(__m256i **)(in_RDI + 0x6d0) = palVar4;
  *(__m256i **)(in_RDI + 0x6d8) = palVar6;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,(int)((ulong)palVar8 >> 0x20));
  *(__m256i **)(in_RDI + 0x6e0) = palVar2;
  *(__m256i **)(in_RDI + 0x6e8) = palVar3;
  *(__m256i **)(in_RDI + 0x6f0) = palVar4;
  *(__m256i **)(in_RDI + 0x6f8) = palVar6;
  *(__m256i **)(in_RDI + 0x500) = palVar16;
  *(__m256i **)(in_RDI + 0x508) = palVar17;
  *(__m256i **)(in_RDI + 0x510) = palVar18;
  *(__m256i **)(in_RDI + 0x518) = in_register_00001218;
  *(__m256i **)(in_RDI + 0x520) = palVar12;
  *(__m256i **)(in_RDI + 0x528) = palVar13;
  *(__m256i **)(in_RDI + 0x530) = palVar14;
  *(__m256i **)(in_RDI + 0x538) = palVar15;
  *(__m256i **)(in_RDI + 0x540) = palVar7;
  *(__m256i **)(in_RDI + 0x548) = palVar8;
  *(__m256i **)(in_RDI + 0x550) = palVar9;
  *(__m256i **)(in_RDI + 0x558) = palVar11;
  *(__m256i **)(in_RDI + 0x560) = in_XMM0_Qa;
  *(__m256i **)(in_RDI + 0x568) = in_XMM0_Qb;
  *(__m256i **)(in_RDI + 0x570) = in_YMM0_H;
  *(__m256i **)(in_RDI + 0x578) = palVar5;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,(int)((ulong)palVar8 >> 0x20));
  iVar10 = (int)((ulong)palVar8 >> 0x20);
  palVar6 = palVar5;
  palVar17 = in_XMM0_Qa;
  palVar18 = in_XMM0_Qb;
  palVar19 = in_YMM0_H;
  half_btf_avx2(palVar14,palVar13,palVar12,palVar11,palVar9,iVar10);
  palVar13 = in_XMM0_Qa;
  palVar14 = in_XMM0_Qb;
  palVar15 = in_YMM0_H;
  palVar16 = palVar6;
  half_btf_avx2(in_YMM0_H,in_XMM0_Qb,in_XMM0_Qa,palVar11,palVar9,iVar10);
  palVar8 = in_XMM0_Qa;
  palVar9 = in_XMM0_Qb;
  palVar11 = in_YMM0_H;
  palVar12 = palVar6;
  half_btf_avx2(palVar15,palVar14,palVar13,palVar6,in_YMM0_H,(int)((ulong)in_XMM0_Qb >> 0x20));
  palVar2 = in_XMM0_Qa;
  palVar3 = in_XMM0_Qb;
  palVar4 = in_YMM0_H;
  palVar7 = palVar6;
  half_btf_avx2(palVar15,palVar14,palVar13,palVar12,palVar11,(int)((ulong)palVar9 >> 0x20));
  *(__m256i **)(in_RDI + 0x600) = palVar2;
  *(__m256i **)(in_RDI + 0x608) = palVar3;
  *(__m256i **)(in_RDI + 0x610) = palVar4;
  *(__m256i **)(in_RDI + 0x618) = palVar6;
  half_btf_avx2(palVar15,palVar14,palVar13,palVar12,palVar11,(int)((ulong)palVar9 >> 0x20));
  *(__m256i **)(in_RDI + 0x620) = palVar2;
  *(__m256i **)(in_RDI + 0x628) = palVar3;
  *(__m256i **)(in_RDI + 0x630) = palVar4;
  *(__m256i **)(in_RDI + 0x638) = palVar6;
  half_btf_avx2(palVar15,palVar14,palVar13,palVar12,palVar11,(int)((ulong)palVar9 >> 0x20));
  *(__m256i **)(in_RDI + 0x640) = palVar2;
  *(__m256i **)(in_RDI + 0x648) = palVar3;
  *(__m256i **)(in_RDI + 0x650) = palVar4;
  *(__m256i **)(in_RDI + 0x658) = palVar6;
  half_btf_avx2(palVar15,palVar14,palVar13,palVar12,palVar11,(int)((ulong)palVar9 >> 0x20));
  *(__m256i **)(in_RDI + 0x660) = palVar2;
  *(__m256i **)(in_RDI + 0x668) = palVar3;
  *(__m256i **)(in_RDI + 0x670) = palVar4;
  *(__m256i **)(in_RDI + 0x678) = palVar6;
  *(__m256i **)(in_RDI + 0x580) = palVar17;
  *(__m256i **)(in_RDI + 0x588) = palVar18;
  *(__m256i **)(in_RDI + 0x590) = palVar19;
  *(__m256i **)(in_RDI + 0x598) = palVar5;
  *(__m256i **)(in_RDI + 0x5a0) = palVar13;
  *(__m256i **)(in_RDI + 0x5a8) = palVar14;
  *(__m256i **)(in_RDI + 0x5b0) = palVar15;
  *(__m256i **)(in_RDI + 0x5b8) = palVar16;
  *(__m256i **)(in_RDI + 0x5c0) = palVar8;
  *(__m256i **)(in_RDI + 0x5c8) = palVar9;
  *(__m256i **)(in_RDI + 0x5d0) = palVar11;
  *(__m256i **)(in_RDI + 0x5d8) = palVar12;
  *(__m256i **)(in_RDI + 0x5e0) = in_XMM0_Qa;
  *(__m256i **)(in_RDI + 0x5e8) = in_XMM0_Qb;
  *(__m256i **)(in_RDI + 0x5f0) = in_YMM0_H;
  *(__m256i **)(in_RDI + 0x5f8) = palVar7;
  return;
}

Assistant:

static inline void idct64_stage10_avx2(__m256i *u, const __m256i *cospim32,
                                       const __m256i *cospi32,
                                       const __m256i *clamp_lo,
                                       const __m256i *clamp_hi,
                                       const __m256i *rnding, int bit) {
  __m256i temp1, temp2, temp3, temp4;
  for (int i = 0; i < 16; i++) {
    addsub_avx2(u[i], u[31 - i], &u[i], &u[31 - i], clamp_lo, clamp_hi);
  }

  temp1 = half_btf_avx2(cospim32, &u[40], cospi32, &u[55], rnding, bit);
  temp2 = half_btf_avx2(cospim32, &u[41], cospi32, &u[54], rnding, bit);
  temp3 = half_btf_avx2(cospim32, &u[42], cospi32, &u[53], rnding, bit);
  temp4 = half_btf_avx2(cospim32, &u[43], cospi32, &u[52], rnding, bit);
  u[52] = half_btf_avx2(cospi32, &u[43], cospi32, &u[52], rnding, bit);
  u[53] = half_btf_avx2(cospi32, &u[42], cospi32, &u[53], rnding, bit);
  u[54] = half_btf_avx2(cospi32, &u[41], cospi32, &u[54], rnding, bit);
  u[55] = half_btf_avx2(cospi32, &u[40], cospi32, &u[55], rnding, bit);
  u[40] = temp1;
  u[41] = temp2;
  u[42] = temp3;
  u[43] = temp4;

  temp1 = half_btf_avx2(cospim32, &u[44], cospi32, &u[51], rnding, bit);
  temp2 = half_btf_avx2(cospim32, &u[45], cospi32, &u[50], rnding, bit);
  temp3 = half_btf_avx2(cospim32, &u[46], cospi32, &u[49], rnding, bit);
  temp4 = half_btf_avx2(cospim32, &u[47], cospi32, &u[48], rnding, bit);
  u[48] = half_btf_avx2(cospi32, &u[47], cospi32, &u[48], rnding, bit);
  u[49] = half_btf_avx2(cospi32, &u[46], cospi32, &u[49], rnding, bit);
  u[50] = half_btf_avx2(cospi32, &u[45], cospi32, &u[50], rnding, bit);
  u[51] = half_btf_avx2(cospi32, &u[44], cospi32, &u[51], rnding, bit);
  u[44] = temp1;
  u[45] = temp2;
  u[46] = temp3;
  u[47] = temp4;
}